

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int32_t length;
  rle16_t *prVar2;
  ushort *puVar3;
  rle16_t *prVar4;
  ushort uVar5;
  _Bool _Var6;
  uint uVar7;
  int32_t pos;
  run_container_t *prVar8;
  array_container_t *paVar9;
  bitset_container_t *src_1_00;
  run_container_t *prVar10;
  int iVar11;
  uint16_t *puVar12;
  uint uVar13;
  int32_t i;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ushort *puVar18;
  uint16_t uVar19;
  uint8_t return_type;
  container_t **local_58;
  run_container_t *local_50;
  array_container_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = dst;
  uVar7 = run_container_cardinality(src_1);
  local_48 = src_2;
  if ((int)uVar7 < 0x21) {
    if (src_2->cardinality != 0) {
      prVar8 = run_container_create_given_capacity(src_2->cardinality + uVar7);
      prVar2 = src_1->runs;
      uVar7 = (uint)prVar2->value;
      uVar15 = (uint)prVar2->value + (uint)prVar2->length + 1;
      puVar3 = src_2->array;
      iVar14 = 0;
      uVar13 = 0;
      puVar18 = puVar3;
LAB_00111d76:
      uVar1 = *puVar18;
      uVar17 = uVar7;
LAB_00111d7e:
      do {
        uVar7 = uVar17;
        uVar5 = (ushort)uVar7;
        uVar19 = (short)uVar15 + ~uVar5;
LAB_00111d8b:
        do {
          if (src_1->n_runs <= (int)uVar13) {
LAB_00111fd3:
            prVar10 = (run_container_t *)convert_run_to_efficient_container(prVar8,&return_type);
            *local_58 = prVar10;
            if (prVar8 != prVar10) {
              run_container_free(prVar8);
            }
            return (uint)return_type;
          }
          if (src_2->cardinality <= iVar14) {
            prVar4 = prVar8->runs;
            lVar16 = (long)prVar8->n_runs;
            prVar8->n_runs = (int32_t)(lVar16 + 1);
            prVar4[lVar16].value = uVar5;
            prVar4[lVar16].length = uVar19;
            iVar14 = uVar13 + 1;
            iVar11 = src_1->n_runs - iVar14;
            if (iVar11 != 0 && iVar14 <= src_1->n_runs) {
              memcpy(prVar4 + lVar16 + 1,prVar2 + iVar14,(long)iVar11 << 2);
              prVar8->n_runs = prVar8->n_runs + ~uVar13 + src_1->n_runs;
            }
            goto LAB_00111fd3;
          }
          uVar17 = (uint)uVar1;
          if (uVar17 < uVar15) {
            if (uVar17 < uVar7) {
              iVar14 = iVar14 + 1;
              if (iVar14 < src_2->cardinality) {
                puVar18 = puVar3 + iVar14;
                goto LAB_00111d76;
              }
              goto LAB_00111d8b;
            }
            if (uVar7 < uVar17) {
              prVar4 = prVar8->runs;
              iVar11 = prVar8->n_runs;
              prVar8->n_runs = iVar11 + 1;
              prVar4[iVar11].value = uVar5;
              prVar4[iVar11].length = ~uVar5 + uVar1;
              src_2 = local_48;
            }
            uVar17 = uVar1 + 1;
            if (uVar1 + 1 < uVar15) goto LAB_00111d7e;
          }
          else {
            prVar4 = prVar8->runs;
            iVar11 = prVar8->n_runs;
            prVar8->n_runs = iVar11 + 1;
            prVar4[iVar11].value = uVar5;
            prVar4[iVar11].length = uVar19;
            src_2 = local_48;
          }
          uVar13 = uVar13 + 1;
        } while (src_1->n_runs <= (int)uVar13);
        uVar15 = (uint)prVar2[(int)uVar13].length + (uint)prVar2[(int)uVar13].value + 1;
        uVar17 = (uint)prVar2[(int)uVar13].value;
      } while( true );
    }
    prVar8 = run_container_clone(src_1);
    *local_58 = prVar8;
    iVar14 = 3;
  }
  else if (uVar7 < 0x1001) {
    paVar9 = array_container_create_given_capacity(uVar7);
    local_40 = 0;
    local_38 = (ulong)(uint)src_1->n_runs;
    if (src_1->n_runs < 1) {
      local_38 = local_40;
    }
    pos = -1;
    iVar14 = 0;
    local_50 = src_1;
    for (; local_40 != local_38; local_40 = local_40 + 1) {
      uVar1 = local_50->runs[local_40].value;
      uVar7 = (uint)uVar1;
      uVar13 = (uint)local_50->runs[local_40].length + (uint)uVar1;
      puVar12 = local_48->array;
      length = local_48->cardinality;
      pos = advanceUntil(puVar12,pos,length,uVar1);
      if (pos < length) {
        uVar15 = (uint)puVar12[pos];
        if (uVar13 < puVar12[pos]) {
          puVar12 = paVar9->array + iVar14;
          for (; uVar7 <= uVar13; uVar7 = uVar7 + 1) {
            *puVar12 = (uint16_t)uVar7;
            iVar14 = iVar14 + 1;
            puVar12 = puVar12 + 1;
          }
        }
        else {
          for (; uVar7 <= uVar13; uVar7 = uVar7 + 1) {
            if (uVar7 == uVar15) {
              iVar11 = pos + 1;
              if (iVar11 < length) {
                uVar15 = (uint)puVar12[iVar11];
                pos = iVar11;
              }
              else {
                uVar15 = 0;
              }
            }
            else {
              lVar16 = (long)iVar14;
              iVar14 = iVar14 + 1;
              paVar9->array[lVar16] = (uint16_t)uVar7;
            }
          }
        }
        pos = pos + -1;
      }
      else {
        puVar12 = paVar9->array + iVar14;
        for (; uVar7 <= uVar13; uVar7 = uVar7 + 1) {
          *puVar12 = (uint16_t)uVar7;
          iVar14 = iVar14 + 1;
          puVar12 = puVar12 + 1;
        }
      }
    }
    paVar9->cardinality = iVar14;
    *local_58 = paVar9;
    iVar14 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(src_1);
    _Var6 = bitset_array_container_iandnot(src_1_00,src_2,local_58);
    iVar14 = 2 - (uint)_Var6;
  }
  return iVar14;
}

Assistant:

int run_array_container_andnot(const run_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    CROARING_MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        CROARING_MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] =
                CROARING_MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
}